

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_mult_matrixf(float *matf)

{
  rf_mat left;
  rf_mat right;
  rf_mat *__dest;
  undefined1 local_d0 [8];
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [64];
  float fStack_50;
  float fStack_4c;
  rf_mat mat;
  float *matf_local;
  
  fStack_50 = *matf;
  fStack_4c = matf[4];
  mat.m0 = matf[8];
  mat.m4 = matf[0xc];
  mat.m8 = matf[1];
  mat.m12 = matf[5];
  mat.m1 = matf[9];
  mat.m5 = matf[0xd];
  mat.m9 = matf[2];
  mat.m13 = matf[6];
  mat.m2 = matf[10];
  mat.m6 = matf[0xe];
  mat.m10 = matf[3];
  mat.m14 = matf[7];
  mat.m3 = matf[0xb];
  mat.m7 = matf[0xf];
  __dest = (rf__ctx->field_0).current_matrix;
  mat._56_8_ = matf;
  memcpy(local_d0,(rf__ctx->field_0).current_matrix,0x40);
  left.m15 = fStack_4c;
  left.m11 = fStack_50;
  right.m4 = mat.m4;
  right.m0 = mat.m0;
  right.m12 = mat.m12;
  right.m8 = mat.m8;
  right.m5 = mat.m5;
  right.m1 = mat.m1;
  right.m13 = mat.m13;
  right.m9 = mat.m9;
  right.m6 = mat.m6;
  right.m2 = mat.m2;
  right.m14 = mat.m14;
  right.m10 = mat.m10;
  right.m7 = mat.m7;
  right.m3 = mat.m3;
  left.m8 = (float)(undefined4)local_c0;
  left.m12 = (float)local_c0._4_4_;
  left.m0 = (float)(undefined4)uStack_c8;
  left.m4 = (float)uStack_c8._4_4_;
  left.m1 = (float)(undefined4)uStack_b8;
  left.m5 = (float)uStack_b8._4_4_;
  left.m9 = (float)(undefined4)local_b0;
  left.m13 = (float)local_b0._4_4_;
  left.m2 = (float)(undefined4)uStack_a8;
  left.m6 = (float)uStack_a8._4_4_;
  left.m10 = (float)(undefined4)local_a0;
  left.m14 = (float)local_a0._4_4_;
  left.m3 = (float)(undefined4)uStack_98;
  left.m7 = (float)uStack_98._4_4_;
  right._56_8_ = __dest;
  rf_mat_mul(left,right);
  memcpy(__dest,local_90,0x40);
  return;
}

Assistant:

RF_API void rf_gfx_mult_matrixf(float* matf)
{
    // rf_mat creation from array
    rf_mat mat = {matf[0], matf[4], matf[8], matf[12],
                  matf[1], matf[5], matf[9], matf[13],
                  matf[2], matf[6], matf[10], matf[14],
                  matf[3], matf[7], matf[11], matf[15] };

    *rf_ctx.current_matrix = rf_mat_mul(*rf_ctx.current_matrix, mat);
}